

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_color_quantize.cpp
# Opt level: O1

bool try_quantize_rgb_blue_contract
               (vfloat4 color0,vfloat4 color1,vint4 *color0_out,vint4 *color1_out,
               quant_method quant_level)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar10 [16];
  
  auVar14._8_56_ = color0._16_56_;
  auVar14._0_8_ = color0.m._8_8_;
  auVar12._8_56_ = color0._8_56_;
  auVar12._0_8_ = color0.m._0_8_;
  auVar10 = auVar12._0_16_;
  auVar13 = vshufps_avx(auVar10,auVar10,0xea);
  auVar13 = vsubps_avx(auVar10,auVar13);
  auVar15._0_4_ = auVar13._0_4_ + color0.m[0];
  auVar15._4_4_ = auVar13._4_4_ + color0.m[1];
  auVar15._8_4_ = auVar13._8_4_ + color0.m[2];
  auVar15._12_4_ = auVar13._12_4_ + color0.m[3];
  auVar10 = auVar14._0_16_;
  auVar13 = vshufps_avx(auVar10,auVar10,0xea);
  auVar13 = vsubps_avx(auVar10,auVar13);
  auVar11._0_4_ = auVar13._0_4_ + color0.m[2];
  auVar11._4_4_ = auVar13._4_4_ + color0.m[3];
  auVar11._8_4_ = auVar13._8_4_ + color0._16_4_;
  auVar11._12_4_ = auVar13._12_4_ + color0._20_4_;
  auVar13 = vcmpps_avx(auVar15,ZEXT816(0) << 0x40,1);
  auVar18._8_4_ = 0x437f0000;
  auVar18._0_8_ = 0x437f0000437f0000;
  auVar18._12_4_ = 0x437f0000;
  auVar10 = vcmpps_avx(auVar18,auVar15,1);
  auVar16 = vcmpps_avx(auVar11,ZEXT816(0) << 0x40,1);
  auVar16 = vorps_avx(auVar13,auVar16);
  auVar13 = vcmpps_avx(auVar18,auVar11,1);
  auVar13 = vorps_avx(auVar10,auVar13);
  auVar13 = vorps_avx(auVar13,auVar16);
  if ((((auVar13 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar13 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar13 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar13[0xf]) {
    auVar16._0_4_ = (int)(auVar15._0_4_ + 0.5);
    auVar16._4_4_ = (int)(auVar15._4_4_ + 0.5);
    auVar16._8_4_ = (int)(auVar15._8_4_ + 0.5);
    auVar16._12_4_ = (int)(auVar15._12_4_ + 0.5);
    auVar10 = vpaddd_avx(auVar16,auVar16);
    auVar13 = vcvtdq2ps_avx(auVar16);
    auVar13 = vsubps_avx(auVar15,auVar13);
    auVar17._8_4_ = 0xbdcccccd;
    auVar17._0_8_ = 0xbdcccccdbdcccccd;
    auVar17._12_4_ = 0xbdcccccd;
    auVar13 = vcmpps_avx(auVar17,auVar13,2);
    auVar16 = vpsubd_avx(auVar10,auVar13);
    uVar7 = quant_level - QUANT_6;
    bVar1 = color_unquant_to_uquant_tables[uVar7][auVar16._0_4_];
    bVar2 = color_unquant_to_uquant_tables[uVar7][auVar16._4_4_];
    auVar13._0_4_ = (int)(auVar11._0_4_ + 0.5);
    auVar13._4_4_ = (int)(auVar11._4_4_ + 0.5);
    auVar13._8_4_ = (int)(auVar11._8_4_ + 0.5);
    auVar13._12_4_ = (int)(auVar11._12_4_ + 0.5);
    auVar10 = vpaddd_avx(auVar13,auVar13);
    auVar13 = vcvtdq2ps_avx(auVar13);
    auVar13 = vsubps_avx(auVar11,auVar13);
    auVar13 = vcmpps_avx(auVar17,auVar13,2);
    auVar13 = vpsubd_avx(auVar10,auVar13);
    bVar3 = color_unquant_to_uquant_tables[uVar7][auVar13._0_4_];
    bVar4 = color_unquant_to_uquant_tables[uVar7][auVar13._4_4_];
    uVar8 = (uint)color_unquant_to_uquant_tables[uVar7][auVar13._8_4_];
    uVar6 = (uint)bVar4 + (uint)bVar3 + uVar8;
    uVar9 = (uint)color_unquant_to_uquant_tables[uVar7][auVar16._8_4_];
    uVar7 = (uint)bVar2 + (uint)bVar1 + uVar9;
    bVar5 = uVar7 < uVar6;
    if (uVar7 < uVar6) {
      auVar13 = vpunpckldq_avx(ZEXT116(bVar3),ZEXT116(bVar4));
      auVar10 = vpunpcklqdq_avx(auVar13,ZEXT416(uVar8));
      auVar13 = vpunpckldq_avx(ZEXT116(bVar1),ZEXT116(bVar2));
      auVar13 = vpunpcklqdq_avx(auVar13,ZEXT416(uVar9));
      *(undefined1 (*) [16])color0_out->m = auVar10;
      *(undefined1 (*) [16])color1_out->m = auVar13;
      return true;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool try_quantize_rgb_blue_contract(
	vfloat4 color0,
	vfloat4 color1,
	vint4& color0_out,
	vint4& color1_out,
	quant_method quant_level
) {
	// Apply inverse blue-contraction
	color0 += color0 - color0.swz<2, 2, 2, 3>();
	color1 += color1 - color1.swz<2, 2, 2, 3>();

	// If anything overflows BC cannot be used
	vmask4 color0_error = (color0 < vfloat4(0.0f)) | (color0 > vfloat4(255.0f));
	vmask4 color1_error = (color1 < vfloat4(0.0f)) | (color1 > vfloat4(255.0f));
	if (any(color0_error | color1_error))
	{
		return false;
	}

	// Quantize the inverse blue-contracted color
	vint4 color0i = quant_color3(quant_level, float_to_int_rtn(color0), color0);
	vint4 color1i = quant_color3(quant_level, float_to_int_rtn(color1), color1);

	// If color #1 is not larger than color #0 then blue-contraction cannot be used
	// We must test afterwards because quantization can change the order
	if (hadd_rgb_s(color1i) <= hadd_rgb_s(color0i))
	{
		return false;
	}

	color0_out = color1i;
	color1_out = color0i;
	return true;
}